

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O0

Index __thiscall
wasm::anon_unknown_21::RedundantSetElimination::getValue
          (RedundantSetElimination *this,Expression *expr,LocalValues *currValues)

{
  LocalGet *pLVar1;
  reference pvVar2;
  Index value;
  LocalGet *get;
  LocalValues *currValues_local;
  Expression *expr_local;
  RedundantSetElimination *this_local;
  
  pLVar1 = Expression::dynCast<wasm::LocalGet>(expr);
  if (pLVar1 == (LocalGet *)0x0) {
    this_local._4_4_ = ValueNumbering::getValue(&this->valueNumbering,expr);
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (currValues,(ulong)pLVar1->index);
    this_local._4_4_ = *pvVar2;
  }
  return this_local._4_4_;
}

Assistant:

Index getValue(Expression* expr, LocalValues& currValues) {
    if (auto* get = expr->dynCast<LocalGet>()) {
      // a copy of whatever that was
      return currValues[get->index];
    }
    auto value = valueNumbering.getValue(expr);
#ifdef RSE_DEBUG
    std::cout << "expr value " << value << '\n';
#endif
    return value;
  }